

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O1

void __thiscall CRegTestParams::CRegTestParams(CRegTestParams *this,RegTestOptions *opts)

{
  uint256 *puVar1;
  CBlock *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  int64_t *piVar2;
  undefined8 uVar3;
  ushort uVar4;
  pointer puVar5;
  _Hash_node_base *p_Var6;
  _Hash_node_base *p_Var7;
  void *pvVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  base_blob<256U> *pbVar11;
  undefined1 *puVar12;
  uint64_t uVar13;
  long lVar14;
  undefined1 *puVar15;
  undefined8 *puVar16;
  CBlock *pCVar17;
  CAmount *in_R9;
  long in_FS_OFFSET;
  byte bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  initializer_list<std::pair<const_int,_uint256>_> __l;
  allocator_type local_141;
  undefined8 local_140;
  undefined1 local_138 [36];
  uchar auStack_114 [4];
  size_t local_110;
  uchar local_108 [32];
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_e8;
  undefined2 uStack_d0;
  bool bStack_ce;
  undefined1 uStack_cd;
  undefined8 uStack_cc;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined8 local_94;
  undefined8 uStack_8c;
  undefined8 local_84;
  undefined8 uStack_7c;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  pointer local_38;
  uchar auStack_30 [16];
  long local_20;
  
  bVar18 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  CChainParams::CChainParams(&this->super_CChainParams);
  (this->super_CChainParams).m_chain_type = REGTEST;
  (this->super_CChainParams).consensus.signet_blocks = false;
  puVar5 = (this->super_CChainParams).consensus.signet_challenge.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_CChainParams).consensus.signet_challenge.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar5) {
    (this->super_CChainParams).consensus.signet_challenge.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
  }
  (this->super_CChainParams).consensus.nSubsidyHalvingInterval = 0x96;
  (this->super_CChainParams).consensus.BIP34Height = 1;
  puVar1 = &(this->super_CChainParams).consensus.BIP34Hash;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[8] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[9] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[10] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xb] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xc] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xd] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xe] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xf] = '\0';
  pbVar11 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[0x10] = '\0';
  (pbVar11->m_data)._M_elems[0x11] = '\0';
  (pbVar11->m_data)._M_elems[0x12] = '\0';
  (pbVar11->m_data)._M_elems[0x13] = '\0';
  (pbVar11->m_data)._M_elems[0x14] = '\0';
  (pbVar11->m_data)._M_elems[0x15] = '\0';
  (pbVar11->m_data)._M_elems[0x16] = '\0';
  (pbVar11->m_data)._M_elems[0x17] = '\0';
  (pbVar11->m_data)._M_elems[0x18] = '\0';
  (pbVar11->m_data)._M_elems[0x19] = '\0';
  (pbVar11->m_data)._M_elems[0x1a] = '\0';
  (pbVar11->m_data)._M_elems[0x1b] = '\0';
  (pbVar11->m_data)._M_elems[0x1c] = '\0';
  (pbVar11->m_data)._M_elems[0x1d] = '\0';
  (pbVar11->m_data)._M_elems[0x1e] = '\0';
  (pbVar11->m_data)._M_elems[0x1f] = '\0';
  (this->super_CChainParams).consensus.BIP65Height = 1;
  (this->super_CChainParams).consensus.BIP66Height = 1;
  (this->super_CChainParams).consensus.CSVHeight = 1;
  (this->super_CChainParams).consensus.SegwitHeight = 0;
  (this->super_CChainParams).consensus.MinBIP9WarningHeight = 0;
  puVar1 = &(this->super_CChainParams).consensus.powLimit;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0xff;
  pbVar11 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[4] = 0xff;
  (pbVar11->m_data)._M_elems[5] = 0xff;
  (pbVar11->m_data)._M_elems[6] = 0xff;
  (pbVar11->m_data)._M_elems[7] = 0xff;
  pbVar11 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[8] = 0xff;
  (pbVar11->m_data)._M_elems[9] = 0xff;
  (pbVar11->m_data)._M_elems[10] = 0xff;
  (pbVar11->m_data)._M_elems[0xb] = 0xff;
  pbVar11 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[0xc] = 0xff;
  (pbVar11->m_data)._M_elems[0xd] = 0xff;
  (pbVar11->m_data)._M_elems[0xe] = 0xff;
  (pbVar11->m_data)._M_elems[0xf] = 0xff;
  pbVar11 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[0xf] = 0xff;
  (pbVar11->m_data)._M_elems[0x10] = 0xff;
  (pbVar11->m_data)._M_elems[0x11] = 0xff;
  (pbVar11->m_data)._M_elems[0x12] = 0xff;
  pbVar11 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[0x13] = 0xff;
  (pbVar11->m_data)._M_elems[0x14] = 0xff;
  (pbVar11->m_data)._M_elems[0x15] = 0xff;
  (pbVar11->m_data)._M_elems[0x16] = 0xff;
  pbVar11 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[0x17] = 0xff;
  (pbVar11->m_data)._M_elems[0x18] = 0xff;
  (pbVar11->m_data)._M_elems[0x19] = 0xff;
  (pbVar11->m_data)._M_elems[0x1a] = 0xff;
  pbVar11 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[0x1b] = 0xff;
  (pbVar11->m_data)._M_elems[0x1c] = 0xff;
  (pbVar11->m_data)._M_elems[0x1d] = 0xff;
  (pbVar11->m_data)._M_elems[0x1e] = 0xff;
  (this->super_CChainParams).consensus.nPowTargetTimespan = 0x15180;
  (this->super_CChainParams).consensus.nPowTargetSpacing = 600;
  *(undefined4 *)
   ((this->super_CChainParams).consensus.powLimit.super_base_blob<256U>.m_data._M_elems + 0x1f) =
       0x101017f;
  (this->super_CChainParams).consensus.nRuleChangeActivationThreshold = 0x6c;
  (this->super_CChainParams).consensus.nMinerConfirmationWindow = 0x90;
  (this->super_CChainParams).consensus.vDeployments[0].bit = 0x1c;
  (this->super_CChainParams).consensus.vDeployments[0].nStartTime = 0;
  (this->super_CChainParams).consensus.vDeployments[0].nTimeout = 0x7fffffffffffffff;
  (this->super_CChainParams).consensus.vDeployments[0].min_activation_height = 0;
  (this->super_CChainParams).consensus.vDeployments[1].bit = 2;
  (this->super_CChainParams).consensus.vDeployments[1].nStartTime = -1;
  (this->super_CChainParams).consensus.vDeployments[1].nTimeout = 0x7fffffffffffffff;
  (this->super_CChainParams).consensus.vDeployments[1].min_activation_height = 0;
  pbVar11 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[0x10] = '\0';
  (pbVar11->m_data)._M_elems[0x11] = '\0';
  (pbVar11->m_data)._M_elems[0x12] = '\0';
  (pbVar11->m_data)._M_elems[0x13] = '\0';
  (pbVar11->m_data)._M_elems[0x14] = '\0';
  (pbVar11->m_data)._M_elems[0x15] = '\0';
  (pbVar11->m_data)._M_elems[0x16] = '\0';
  (pbVar11->m_data)._M_elems[0x17] = '\0';
  (pbVar11->m_data)._M_elems[0x18] = '\0';
  (pbVar11->m_data)._M_elems[0x19] = '\0';
  (pbVar11->m_data)._M_elems[0x1a] = '\0';
  (pbVar11->m_data)._M_elems[0x1b] = '\0';
  (pbVar11->m_data)._M_elems[0x1c] = '\0';
  (pbVar11->m_data)._M_elems[0x1d] = '\0';
  (pbVar11->m_data)._M_elems[0x1e] = '\0';
  (pbVar11->m_data)._M_elems[0x1f] = '\0';
  puVar1 = &(this->super_CChainParams).consensus.nMinimumChainWork;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[8] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[9] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[10] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xb] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xc] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xd] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xe] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xf] = '\0';
  puVar1 = &(this->super_CChainParams).consensus.defaultAssumeValid;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[8] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[9] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[10] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xb] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xc] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xd] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xe] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xf] = '\0';
  pbVar11 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar11->m_data)._M_elems[0x10] = '\0';
  (pbVar11->m_data)._M_elems[0x11] = '\0';
  (pbVar11->m_data)._M_elems[0x12] = '\0';
  (pbVar11->m_data)._M_elems[0x13] = '\0';
  (pbVar11->m_data)._M_elems[0x14] = '\0';
  (pbVar11->m_data)._M_elems[0x15] = '\0';
  (pbVar11->m_data)._M_elems[0x16] = '\0';
  (pbVar11->m_data)._M_elems[0x17] = '\0';
  (pbVar11->m_data)._M_elems[0x18] = '\0';
  (pbVar11->m_data)._M_elems[0x19] = '\0';
  (pbVar11->m_data)._M_elems[0x1a] = '\0';
  (pbVar11->m_data)._M_elems[0x1b] = '\0';
  (pbVar11->m_data)._M_elems[0x1c] = '\0';
  (pbVar11->m_data)._M_elems[0x1d] = '\0';
  (pbVar11->m_data)._M_elems[0x1e] = '\0';
  (pbVar11->m_data)._M_elems[0x1f] = '\0';
  *(undefined4 *)(this->super_CChainParams).pchMessageStart._M_elems = 0xdab5bffa;
  (this->super_CChainParams).nDefaultPort = 0x480c;
  uVar13 = 1000;
  if (opts->fastprune != false) {
    uVar13 = 100;
  }
  (this->super_CChainParams).nPruneAfterHeight = uVar13;
  (this->super_CChainParams).m_assumed_blockchain_size = 0;
  (this->super_CChainParams).m_assumed_chain_state_size = 0;
  for (p_Var6 = (opts->activation_heights)._M_h._M_before_begin._M_nxt;
      p_Var6 != (_Hash_node_base *)0x0; p_Var6 = p_Var6->_M_nxt) {
    switch(*(undefined2 *)&p_Var6[1]._M_nxt) {
    case 0x8000:
      (this->super_CChainParams).consensus.BIP34Height = *(int *)((long)&p_Var6[1]._M_nxt + 4);
      break;
    case 0x8001:
      (this->super_CChainParams).consensus.BIP65Height = *(int *)((long)&p_Var6[1]._M_nxt + 4);
      break;
    case 0x8002:
      (this->super_CChainParams).consensus.BIP66Height = *(int *)((long)&p_Var6[1]._M_nxt + 4);
      break;
    case 0x8003:
      (this->super_CChainParams).consensus.CSVHeight = *(int *)((long)&p_Var6[1]._M_nxt + 4);
      break;
    case 0x8004:
      (this->super_CChainParams).consensus.SegwitHeight = *(int *)((long)&p_Var6[1]._M_nxt + 4);
    }
  }
  for (p_Var6 = (opts->version_bits_parameters)._M_h._M_before_begin._M_nxt;
      p_Var6 != (_Hash_node_base *)0x0; p_Var6 = p_Var6->_M_nxt) {
    uVar4 = *(ushort *)&p_Var6[1]._M_nxt;
    p_Var7 = p_Var6[3]._M_nxt;
    piVar2 = &(this->super_CChainParams).consensus.vDeployments[uVar4].nStartTime;
    *piVar2 = (int64_t)p_Var6[2]._M_nxt;
    piVar2[1] = (int64_t)p_Var7;
    (this->super_CChainParams).consensus.vDeployments[uVar4].min_activation_height =
         *(int *)&p_Var6[4]._M_nxt;
  }
  local_140 = 5000000000;
  CreateGenesisBlock((CBlock *)local_138,0x4d49e5da,2,0x207fffff,(int32_t)&local_140,in_R9);
  this_00 = &(this->super_CChainParams).genesis;
  puVar16 = (undefined8 *)local_138;
  pCVar17 = this_00;
  for (lVar14 = 10; lVar14 != 0; lVar14 = lVar14 + -1) {
    uVar3 = *puVar16;
    (pCVar17->super_CBlockHeader).nVersion = (int)uVar3;
    (pCVar17->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] =
         (char)((ulong)uVar3 >> 0x20);
    (pCVar17->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] =
         (char)((ulong)uVar3 >> 0x28);
    (pCVar17->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] =
         (char)((ulong)uVar3 >> 0x30);
    (pCVar17->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] =
         (char)((ulong)uVar3 >> 0x38);
    puVar16 = puVar16 + (ulong)bVar18 * -2 + 1;
    pCVar17 = (CBlock *)((long)pCVar17 + (ulong)bVar18 * -0x10 + 8);
  }
  local_48._0_8_ =
       (this->super_CChainParams).genesis.vtx.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48._8_8_ =
       (this->super_CChainParams).genesis.vtx.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = (this->super_CChainParams).genesis.vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).genesis.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_e8.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         local_e8.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_);
  (this->super_CChainParams).genesis.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_e8.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                         local_e8.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._0_4_);
  (this->super_CChainParams).genesis.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_e8.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                         local_e8.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
  local_e8.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  local_e8.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  local_e8.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_e8.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_e8.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_e8.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_48);
  (this->super_CChainParams).genesis.m_checked_merkle_root = bStack_ce;
  (this->super_CChainParams).genesis.fChecked = uStack_d0._0_1_;
  (this->super_CChainParams).genesis.m_checked_witness_commitment = uStack_d0._1_1_;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_e8);
  CBlockHeader::GetHash((uint256 *)local_138,&this_00->super_CBlockHeader);
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 0x10) =
       CONCAT17(local_138[0x17],
                CONCAT16(local_138[0x16],
                         CONCAT15(local_138[0x15],
                                  CONCAT14(local_138[0x14],
                                           CONCAT13(local_138[0x13],
                                                    CONCAT12(local_138[0x12],
                                                             CONCAT11(local_138[0x11],
                                                                      local_138[0x10])))))));
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 0x18) =
       CONCAT17(local_138[0x1f],
                CONCAT16(local_138[0x1e],
                         CONCAT15(local_138[0x1d],
                                  CONCAT14(local_138[0x1c],
                                           CONCAT13(local_138[0x1b],
                                                    CONCAT12(local_138[0x1a],
                                                             CONCAT11(local_138[0x19],
                                                                      local_138[0x18])))))));
  *(ulong *)(this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
            _M_elems =
       CONCAT17(local_138[7],
                CONCAT16(local_138[6],
                         CONCAT15(local_138[5],
                                  CONCAT14(local_138[4],
                                           CONCAT13(local_138[3],
                                                    CONCAT12(local_138[2],
                                                             CONCAT11(local_138[1],local_138[0])))))
                        ));
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 8) =
       CONCAT17(local_138[0xf],
                CONCAT16(local_138[0xe],
                         CONCAT15(local_138[0xd],
                                  CONCAT14(local_138[0xc],
                                           CONCAT13(local_138[0xb],
                                                    CONCAT12(local_138[10],
                                                             CONCAT11(local_138[9],local_138[8])))))
                        ));
  local_138[0] = '\x06';
  local_138[1] = '\"';
  local_138[2] = 'n';
  local_138[3] = 'F';
  local_138[4] = '\x11';
  local_138[5] = '\x1a';
  local_138[6] = '\v';
  local_138[7] = 'Y';
  local_138[8] = 0xca;
  local_138[9] = 0xaf;
  local_138[10] = 0x12;
  local_138[0xb] = 0x60;
  local_138[0xc] = 'C';
  local_138[0xd] = 0xeb;
  local_138[0xe] = '[';
  local_138[0xf] = 0xbf;
  local_138[0x10] = '(';
  local_138[0x11] = 0xc3;
  local_138[0x12] = 'O';
  local_138[0x13] = ':';
  local_138[0x14] = '^';
  local_138[0x15] = '3';
  local_138[0x16] = '*';
  local_138[0x17] = '\x1f';
  local_138[0x18] = 199;
  local_138[0x19] = 0xb2;
  local_138[0x1a] = 0xb7;
  local_138[0x1b] = '<';
  local_138[0x1c] = 0xf1;
  local_138[0x1d] = 0x88;
  local_138[0x1e] = 0x91;
  local_138[0x1f] = '\x0f';
  auVar21[0] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x10] == '(');
  auVar21[1] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x11] == 0xc3);
  auVar21[2] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x12] == 'O');
  auVar21[3] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x13] == ':');
  auVar21[4] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x14] == '^');
  auVar21[5] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x15] == '3');
  auVar21[6] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x16] == '*');
  auVar21[7] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x17] == '\x1f');
  auVar21[8] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x18] == 199);
  auVar21[9] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x19] == 0xb2);
  auVar21[10] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data
                  ._M_elems[0x1a] == 0xb7);
  auVar21[0xb] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1b] == '<');
  auVar21[0xc] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1c] == 0xf1);
  auVar21[0xd] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1d] == 0x88);
  auVar21[0xe] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1e] == 0x91);
  auVar21[0xf] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1f] == '\x0f');
  auVar19[0] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0] == '\x06');
  auVar19[1] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[1] == '\"');
  auVar19[2] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[2] == 'n');
  auVar19[3] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[3] == 'F');
  auVar19[4] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[4] == '\x11');
  auVar19[5] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[5] == '\x1a');
  auVar19[6] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[6] == '\v');
  auVar19[7] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[7] == 'Y');
  auVar19[8] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[8] == 0xca);
  auVar19[9] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[9] == 0xaf);
  auVar19[10] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data
                  ._M_elems[10] == '\x12');
  auVar19[0xb] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xb] == '`');
  auVar19[0xc] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xc] == 'C');
  auVar19[0xd] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xd] == 0xeb);
  auVar19[0xe] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xe] == '[');
  auVar19[0xf] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xf] == 0xbf);
  auVar19 = auVar19 & auVar21;
  if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("consensus.hashGenesisBlock == uint256{\"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206\"}"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/chainparams.cpp"
                  ,600,"CRegTestParams::CRegTestParams(const RegTestOptions &)");
  }
  local_138[0] = ';';
  local_138[1] = 0xa3;
  local_138[2] = 0xed;
  local_138[3] = 0xfd;
  local_138[4] = 'z';
  local_138[5] = '{';
  local_138[6] = '\x12';
  local_138[7] = 0xb2;
  local_138[8] = 0x7a;
  local_138[9] = 199;
  local_138[10] = 0x2c;
  local_138[0xb] = 0x3e;
  local_138[0xc] = 'g';
  local_138[0xd] = 'v';
  local_138[0xe] = 0x8f;
  local_138[0xf] = 'a';
  local_138[0x10] = '\x7f';
  local_138[0x11] = 200;
  local_138[0x12] = '\x1b';
  local_138[0x13] = 0xc3;
  local_138[0x14] = 0x88;
  local_138[0x15] = 0x8a;
  local_138[0x16] = 'Q';
  local_138[0x17] = '2';
  local_138[0x18] = ':';
  local_138[0x19] = 0x9f;
  local_138[0x1a] = 0xb8;
  local_138[0x1b] = 0xaa;
  local_138[0x1c] = 'K';
  local_138[0x1d] = '\x1e';
  local_138[0x1e] = '^';
  local_138[0x1f] = 'J';
  auVar22[0] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x10) ==
                '\x7f');
  auVar22[1] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x11) ==
                200);
  auVar22[2] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x12) ==
                '\x1b');
  auVar22[3] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x13) ==
                0xc3);
  auVar22[4] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x14) ==
                0x88);
  auVar22[5] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x15) ==
                0x8a);
  auVar22[6] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x16) ==
                'Q');
  auVar22[7] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x17) ==
                '2');
  auVar22[8] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x18) ==
                ':');
  auVar22[9] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x19) ==
                0x9f);
  auVar22[10] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                   hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1a) ==
                 0xb8);
  auVar22[0xb] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1b) ==
                  0xaa);
  auVar22[0xc] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1c) ==
                  'K');
  auVar22[0xd] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1d) ==
                  '\x1e');
  auVar22[0xe] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1e) ==
                  '^');
  auVar22[0xf] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1f) ==
                  'J');
  auVar20[0] = -((this->super_CChainParams).genesis.super_CBlockHeader.hashMerkleRoot.
                 super_base_blob<256U>.m_data._M_elems[0] == ';');
  auVar20[1] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 1) == 0xa3)
  ;
  auVar20[2] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 2) == 0xed)
  ;
  auVar20[3] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 3) == 0xfd)
  ;
  auVar20[4] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 4) == 'z');
  auVar20[5] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 5) == '{');
  auVar20[6] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 6) ==
                '\x12');
  auVar20[7] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 7) == 0xb2)
  ;
  auVar20[8] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 8) == 'z');
  auVar20[9] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 9) == 199);
  auVar20[10] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                   hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 10) == ','
                 );
  auVar20[0xb] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xb) ==
                  '>');
  auVar20[0xc] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc) ==
                  'g');
  auVar20[0xd] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xd) ==
                  'v');
  auVar20[0xe] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xe) ==
                  0x8f);
  auVar20[0xf] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xf) ==
                  'a');
  auVar20 = auVar20 & auVar22;
  if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("genesis.hashMerkleRoot == uint256{\"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b\"}"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x259,"CRegTestParams::CRegTestParams(const RegTestOptions &)");
  }
  puVar5 = (this->super_CChainParams).vFixedSeeds.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_CChainParams).vFixedSeeds.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar5) {
    (this->super_CChainParams).vFixedSeeds.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
  }
  this_01 = &(this->super_CChainParams).vSeeds;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(this_01,(this->super_CChainParams).vSeeds.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[19]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [19])"dummySeed.invalid.");
  (this->super_CChainParams).fDefaultConsistencyChecks = true;
  (this->super_CChainParams).m_is_mockable_chain = true;
  local_38 = (pointer)0x3a4fc328bf5beb43;
  auStack_30[0] = '^';
  auStack_30[1] = '3';
  auStack_30[2] = '*';
  auStack_30[3] = '\x1f';
  auStack_30[4] = 199;
  auStack_30[5] = 0xb2;
  auStack_30[6] = 0xb7;
  auStack_30[7] = '<';
  local_48._8_8_ = 0x6012afca590b1a11;
  local_48._0_8_ = 0x466e220600000000;
  auStack_30[8] = 0xf1;
  auStack_30[9] = 0x88;
  auStack_30[10] = 0x91;
  auStack_30[0xb] = '\x0f';
  __l._M_len = 1;
  __l._M_array = (iterator)local_48;
  std::map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>::map
            ((map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_> *)
             local_138,__l,(less<int> *)&local_140,&local_141);
  std::
  _Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
  ::clear((_Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
           *)&(this->super_CChainParams).checkpointData);
  p_Var10 = (_Base_ptr)CONCAT44(auStack_114,local_138._32_4_);
  p_Var9 = (_Base_ptr)
           CONCAT17(local_138[0x17],
                    CONCAT16(local_138[0x16],
                             CONCAT15(local_138[0x15],
                                      CONCAT14(local_138[0x14],
                                               CONCAT13(local_138[0x13],
                                                        CONCAT12(local_138[0x12],
                                                                 CONCAT11(local_138[0x11],
                                                                          local_138[0x10])))))));
  if (p_Var9 != (_Base_ptr)0x0) {
    p_Var10 = (_Base_ptr)(local_138 + 8);
    (this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_color =
         CONCAT13(local_138[0xb],CONCAT12(local_138[10],CONCAT11(local_138[9],local_138[8])));
    *(_Base_ptr *)
     ((long)&(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
             super__Rb_tree_header._M_header + 8) = p_Var9;
    *(_Base_ptr *)
     ((long)&(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x10) =
         (_Base_ptr)
         CONCAT17(local_138[0x1f],
                  CONCAT16(local_138[0x1e],
                           CONCAT15(local_138[0x1d],
                                    CONCAT14(local_138[0x1c],
                                             CONCAT13(local_138[0x1b],
                                                      CONCAT12(local_138[0x1a],
                                                               CONCAT11(local_138[0x19],
                                                                        local_138[0x18])))))));
    *(_Base_ptr *)
     ((long)&(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x18) =
         (_Base_ptr)CONCAT44(auStack_114,local_138._32_4_);
    p_Var9->_M_parent =
         &(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
          super__Rb_tree_header._M_header;
    (this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = local_110;
    local_138[0x10] = '\0';
    local_138[0x11] = '\0';
    local_138[0x12] = '\0';
    local_138[0x13] = '\0';
    local_138[0x14] = '\0';
    local_138[0x15] = '\0';
    local_138[0x16] = '\0';
    local_138[0x17] = '\0';
    local_138[0x18] = (uchar)p_Var10;
    local_138[0x19] = (uchar)((ulong)p_Var10 >> 8);
    local_138[0x1a] = (uchar)((ulong)p_Var10 >> 0x10);
    local_138[0x1b] = (uchar)((ulong)p_Var10 >> 0x18);
    local_138[0x1c] = (uchar)((ulong)p_Var10 >> 0x20);
    local_138[0x1d] = (uchar)((ulong)p_Var10 >> 0x28);
    local_138[0x1e] = (uchar)((ulong)p_Var10 >> 0x30);
    local_138[0x1f] = (uchar)((ulong)p_Var10 >> 0x38);
    local_110 = 0;
  }
  unique0x10004dd2 = p_Var10;
  std::
  _Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
               *)local_138);
  local_138[0] = 'n';
  local_138[1] = '\0';
  local_138[2] = '\0';
  local_138[3] = '\0';
  local_138[4] = 0xd1;
  local_138[5] = '\t';
  local_138[6] = '\x06';
  local_138[7] = 0x83;
  local_138[8] = 0xf1;
  local_138[9] = 0x12;
  local_138[10] = 0x56;
  local_138[0xb] = 0x90;
  local_138[0xc] = 0xb6;
  local_138[0xd] = 0xb1;
  local_138[0xe] = 'd';
  local_138[0xf] = '7';
  local_138[0x10] = '\x14';
  local_138[0x11] = '\\';
  local_138[0x12] = '\x7f';
  local_138[0x13] = 0xba;
  local_138[0x14] = ']';
  local_138[0x15] = '-';
  local_138[0x16] = 0x81;
  local_138[0x17] = 0x9e;
  local_138[0x18] = 'x';
  local_138[0x19] = 0x96;
  local_138[0x1a] = 199;
  local_138[0x1b] = 0xcb;
  local_138[0x1c] = 0xb0;
  local_138[0x1d] = 'M';
  local_138[0x1e] = 0xfe;
  local_138[0x1f] = 0xd4;
  local_138[0x20] = '6';
  local_138[0x21] = 0xb7;
  local_138[0x22] = 'W';
  local_138[0x23] = 'f';
  local_110 = 0x6f;
  local_108[0] = '\\';
  local_108[1] = 'B';
  local_108[2] = 'P';
  local_108[3] = 0xab;
  local_108[4] = 0xc0;
  local_108[5] = 0xae;
  local_108[6] = 0xc0;
  local_108[7] = 0x98;
  local_108[8] = 0xf2;
  local_108[9] = 0xd9;
  local_108[10] = 'O';
  local_108[0xb] = '<';
  local_108[0xc] = 'z';
  local_108[0xd] = 'd';
  local_108[0xe] = '\x05';
  local_108[0xf] = 'A';
  local_108._16_8_ = 0x7ee134edceeeeaaa;
  local_108._24_8_ = 0x696e92821f65549c;
  local_e8.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 200;
  local_e8.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0x421738f2;
  local_e8.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x8dd7c9c1;
  local_e8.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0x76d02ac6;
  local_e8.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x64dc8d79;
  local_e8.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x609ece39;
  uStack_d0._0_1_ = true;
  uStack_d0._1_1_ = true;
  bStack_ce = true;
  uStack_cd = 0xb0;
  uStack_cc = 0x4f34d431c3e482f6;
  local_c0 = 0xc9;
  local_b8 = 0x37608b139ea63b27;
  uStack_b0 = 0xc3515488ad99412c;
  local_a8 = 0x5aa339d00bbf8cf1;
  uStack_a0 = 0x5e93653318f294fb;
  local_98 = 299;
  local_94 = 0x75941497d2493c27;
  uStack_8c = 0x9f8a3903daf08838;
  local_84 = 0x45c49ebba8fa9119;
  uStack_7c = 0xa4bf3407ccb2cc01;
  local_70 = 0x14e;
  local_68 = 0xca24188e6d7d96c0;
  uStack_60 = 0x6afee2c7bada3a0c;
  local_58 = 0x39b7a521ac1ba931;
  uStack_50 = 0x3bb7ce5eba0be489;
  std::vector<AssumeutxoData,std::allocator<AssumeutxoData>>::_M_assign_aux<AssumeutxoData_const*>
            ((vector<AssumeutxoData,std::allocator<AssumeutxoData>> *)
             &(this->super_CChainParams).m_assumeutxo_data,local_138,local_48);
  (this->super_CChainParams).chainTxData.nTime = 0;
  (this->super_CChainParams).chainTxData.tx_count = 0;
  (this->super_CChainParams).chainTxData.dTxRate = 0.0;
  local_138[0x10] = '\0';
  local_138[0x11] = '\0';
  local_138[0x12] = '\0';
  local_138[0x13] = '\0';
  local_138[0x14] = '\0';
  local_138[0x15] = '\0';
  local_138[0x16] = '\0';
  local_138[0x17] = '\0';
  local_138[0] = '\0';
  local_138[1] = '\0';
  local_138[2] = '\0';
  local_138[3] = '\0';
  local_138[4] = '\0';
  local_138[5] = '\0';
  local_138[6] = '\0';
  local_138[7] = '\0';
  local_138[8] = _S_red;
  local_138[9] = _S_red >> 8;
  local_138[10] = _S_red >> 0x10;
  local_138[0xb] = _S_red >> 0x18;
  local_138[0xc] = '\0';
  local_138[0xd] = '\0';
  local_138[0xe] = '\0';
  local_138[0xf] = '\0';
  puVar12 = (undefined1 *)operator_new(1);
  local_138[0] = (uchar)puVar12;
  local_138[1] = (uchar)((ulong)puVar12 >> 8);
  local_138[2] = (uchar)((ulong)puVar12 >> 0x10);
  local_138[3] = (uchar)((ulong)puVar12 >> 0x18);
  local_138[4] = (uchar)((ulong)puVar12 >> 0x20);
  local_138[5] = (uchar)((ulong)puVar12 >> 0x28);
  local_138[6] = (uchar)((ulong)puVar12 >> 0x30);
  local_138[7] = (uchar)((ulong)puVar12 >> 0x38);
  puVar15 = puVar12 + 1;
  local_138[0x10] = SUB81(puVar15,0);
  local_138[0x11] = (undefined1)((ulong)puVar15 >> 8);
  local_138[0x12] = (undefined1)((ulong)puVar15 >> 0x10);
  local_138[0x13] = (undefined1)((ulong)puVar15 >> 0x18);
  local_138[0x14] = (uchar)((ulong)puVar15 >> 0x20);
  local_138[0x15] = (uchar)((ulong)puVar15 >> 0x28);
  local_138[0x16] = (uchar)((ulong)puVar15 >> 0x30);
  local_138[0x17] = (uchar)((ulong)puVar15 >> 0x38);
  *puVar12 = 0x6f;
  local_138[8] = local_138[0x10];
  local_138[9] = local_138[0x11];
  local_138[10] = local_138[0x12];
  local_138[0xb] = local_138[0x13];
  local_138[0xc] = local_138[0x14];
  local_138[0xd] = local_138[0x15];
  local_138[0xe] = local_138[0x16];
  local_138[0xf] = local_138[0x17];
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes,local_138);
  pvVar8 = (void *)CONCAT17(local_138[7],
                            CONCAT16(local_138[6],
                                     CONCAT15(local_138[5],
                                              CONCAT14(local_138[4],
                                                       CONCAT13(local_138[3],
                                                                CONCAT12(local_138[2],
                                                                         CONCAT11(local_138[1],
                                                                                  local_138[0]))))))
                           );
  if (pvVar8 != (void *)0x0) {
    operator_delete(pvVar8,CONCAT17(local_138[0x17],
                                    CONCAT16(local_138[0x16],
                                             CONCAT15(local_138[0x15],
                                                      CONCAT14(local_138[0x14],
                                                               CONCAT13(local_138[0x13],
                                                                        CONCAT12(local_138[0x12],
                                                                                 CONCAT11(local_138[
                                                  0x11],local_138[0x10]))))))) - (long)pvVar8);
  }
  local_138[0] = '\0';
  local_138[1] = '\0';
  local_138[2] = '\0';
  local_138[3] = '\0';
  local_138[4] = '\0';
  local_138[5] = '\0';
  local_138[6] = '\0';
  local_138[7] = '\0';
  local_138[8] = _S_red;
  local_138[9] = _S_red >> 8;
  local_138[10] = _S_red >> 0x10;
  local_138[0xb] = _S_red >> 0x18;
  local_138[0xc] = '\0';
  local_138[0xd] = '\0';
  local_138[0xe] = '\0';
  local_138[0xf] = '\0';
  local_138[0x10] = '\0';
  local_138[0x11] = '\0';
  local_138[0x12] = '\0';
  local_138[0x13] = '\0';
  local_138[0x14] = '\0';
  local_138[0x15] = '\0';
  local_138[0x16] = '\0';
  local_138[0x17] = '\0';
  puVar12 = (undefined1 *)operator_new(1);
  local_138[0] = (uchar)puVar12;
  local_138[1] = (uchar)((ulong)puVar12 >> 8);
  local_138[2] = (uchar)((ulong)puVar12 >> 0x10);
  local_138[3] = (uchar)((ulong)puVar12 >> 0x18);
  local_138[4] = (uchar)((ulong)puVar12 >> 0x20);
  local_138[5] = (uchar)((ulong)puVar12 >> 0x28);
  local_138[6] = (uchar)((ulong)puVar12 >> 0x30);
  local_138[7] = (uchar)((ulong)puVar12 >> 0x38);
  puVar15 = puVar12 + 1;
  local_138[0x10] = SUB81(puVar15,0);
  local_138[0x11] = (undefined1)((ulong)puVar15 >> 8);
  local_138[0x12] = (undefined1)((ulong)puVar15 >> 0x10);
  local_138[0x13] = (undefined1)((ulong)puVar15 >> 0x18);
  local_138[0x14] = (uchar)((ulong)puVar15 >> 0x20);
  local_138[0x15] = (uchar)((ulong)puVar15 >> 0x28);
  local_138[0x16] = (uchar)((ulong)puVar15 >> 0x30);
  local_138[0x17] = (uchar)((ulong)puVar15 >> 0x38);
  *puVar12 = 0xc4;
  local_138[8] = local_138[0x10];
  local_138[9] = local_138[0x11];
  local_138[10] = local_138[0x12];
  local_138[0xb] = local_138[0x13];
  local_138[0xc] = local_138[0x14];
  local_138[0xd] = local_138[0x15];
  local_138[0xe] = local_138[0x16];
  local_138[0xf] = local_138[0x17];
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes + 1,local_138);
  pvVar8 = (void *)CONCAT17(local_138[7],
                            CONCAT16(local_138[6],
                                     CONCAT15(local_138[5],
                                              CONCAT14(local_138[4],
                                                       CONCAT13(local_138[3],
                                                                CONCAT12(local_138[2],
                                                                         CONCAT11(local_138[1],
                                                                                  local_138[0]))))))
                           );
  if (pvVar8 != (void *)0x0) {
    operator_delete(pvVar8,CONCAT17(local_138[0x17],
                                    CONCAT16(local_138[0x16],
                                             CONCAT15(local_138[0x15],
                                                      CONCAT14(local_138[0x14],
                                                               CONCAT13(local_138[0x13],
                                                                        CONCAT12(local_138[0x12],
                                                                                 CONCAT11(local_138[
                                                  0x11],local_138[0x10]))))))) - (long)pvVar8);
  }
  local_138[0] = '\0';
  local_138[1] = '\0';
  local_138[2] = '\0';
  local_138[3] = '\0';
  local_138[4] = '\0';
  local_138[5] = '\0';
  local_138[6] = '\0';
  local_138[7] = '\0';
  local_138[8] = _S_red;
  local_138[9] = _S_red >> 8;
  local_138[10] = _S_red >> 0x10;
  local_138[0xb] = _S_red >> 0x18;
  local_138[0xc] = '\0';
  local_138[0xd] = '\0';
  local_138[0xe] = '\0';
  local_138[0xf] = '\0';
  local_138[0x10] = '\0';
  local_138[0x11] = '\0';
  local_138[0x12] = '\0';
  local_138[0x13] = '\0';
  local_138[0x14] = '\0';
  local_138[0x15] = '\0';
  local_138[0x16] = '\0';
  local_138[0x17] = '\0';
  puVar12 = (undefined1 *)operator_new(1);
  local_138[0] = (uchar)puVar12;
  local_138[1] = (uchar)((ulong)puVar12 >> 8);
  local_138[2] = (uchar)((ulong)puVar12 >> 0x10);
  local_138[3] = (uchar)((ulong)puVar12 >> 0x18);
  local_138[4] = (uchar)((ulong)puVar12 >> 0x20);
  local_138[5] = (uchar)((ulong)puVar12 >> 0x28);
  local_138[6] = (uchar)((ulong)puVar12 >> 0x30);
  local_138[7] = (uchar)((ulong)puVar12 >> 0x38);
  puVar15 = puVar12 + 1;
  local_138[0x10] = SUB81(puVar15,0);
  local_138[0x11] = (undefined1)((ulong)puVar15 >> 8);
  local_138[0x12] = (undefined1)((ulong)puVar15 >> 0x10);
  local_138[0x13] = (undefined1)((ulong)puVar15 >> 0x18);
  local_138[0x14] = (uchar)((ulong)puVar15 >> 0x20);
  local_138[0x15] = (uchar)((ulong)puVar15 >> 0x28);
  local_138[0x16] = (uchar)((ulong)puVar15 >> 0x30);
  local_138[0x17] = (uchar)((ulong)puVar15 >> 0x38);
  *puVar12 = 0xef;
  local_138[8] = local_138[0x10];
  local_138[9] = local_138[0x11];
  local_138[10] = local_138[0x12];
  local_138[0xb] = local_138[0x13];
  local_138[0xc] = local_138[0x14];
  local_138[0xd] = local_138[0x15];
  local_138[0xe] = local_138[0x16];
  local_138[0xf] = local_138[0x17];
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes + 2,local_138);
  pvVar8 = (void *)CONCAT17(local_138[7],
                            CONCAT16(local_138[6],
                                     CONCAT15(local_138[5],
                                              CONCAT14(local_138[4],
                                                       CONCAT13(local_138[3],
                                                                CONCAT12(local_138[2],
                                                                         CONCAT11(local_138[1],
                                                                                  local_138[0]))))))
                           );
  if (pvVar8 != (void *)0x0) {
    operator_delete(pvVar8,CONCAT17(local_138[0x17],
                                    CONCAT16(local_138[0x16],
                                             CONCAT15(local_138[0x15],
                                                      CONCAT14(local_138[0x14],
                                                               CONCAT13(local_138[0x13],
                                                                        CONCAT12(local_138[0x12],
                                                                                 CONCAT11(local_138[
                                                  0x11],local_138[0x10]))))))) - (long)pvVar8);
  }
  local_138[0] = '\x04';
  local_138[1] = '5';
  local_138[2] = 0x87;
  local_138[3] = 0xcf;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 3),local_138);
  local_138[0] = '\x04';
  local_138[1] = '5';
  local_138[2] = 0x83;
  local_138[3] = 0x94;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 4));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&(this->super_CChainParams).bech32_hrp,0,
             (this->super_CChainParams).bech32_hrp._M_string_length,"bcrt",4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit CRegTestParams(const RegTestOptions& opts)
    {
        m_chain_type = ChainType::REGTEST;
        consensus.signet_blocks = false;
        consensus.signet_challenge.clear();
        consensus.nSubsidyHalvingInterval = 150;
        consensus.BIP34Height = 1; // Always active unless overridden
        consensus.BIP34Hash = uint256();
        consensus.BIP65Height = 1;  // Always active unless overridden
        consensus.BIP66Height = 1;  // Always active unless overridden
        consensus.CSVHeight = 1;    // Always active unless overridden
        consensus.SegwitHeight = 0; // Always active unless overridden
        consensus.MinBIP9WarningHeight = 0;
        consensus.powLimit = uint256{"7fffffffffffffffffffffffffffffffffffffffffffffffffffffffffffffff"};
        consensus.nPowTargetTimespan = 24 * 60 * 60; // one day
        consensus.nPowTargetSpacing = 10 * 60;
        consensus.fPowAllowMinDifficultyBlocks = true;
        consensus.enforce_BIP94 = true;
        consensus.fPowNoRetargeting = true;
        consensus.nRuleChangeActivationThreshold = 108; // 75% for testchains
        consensus.nMinerConfirmationWindow = 144; // Faster than normal for regtest (144 instead of 2016)

        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].bit = 28;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nStartTime = 0;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].min_activation_height = 0; // No activation delay

        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].bit = 2;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nStartTime = Consensus::BIP9Deployment::ALWAYS_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].min_activation_height = 0; // No activation delay

        consensus.nMinimumChainWork = uint256{};
        consensus.defaultAssumeValid = uint256{};

        pchMessageStart[0] = 0xfa;
        pchMessageStart[1] = 0xbf;
        pchMessageStart[2] = 0xb5;
        pchMessageStart[3] = 0xda;
        nDefaultPort = 18444;
        nPruneAfterHeight = opts.fastprune ? 100 : 1000;
        m_assumed_blockchain_size = 0;
        m_assumed_chain_state_size = 0;

        for (const auto& [dep, height] : opts.activation_heights) {
            switch (dep) {
            case Consensus::BuriedDeployment::DEPLOYMENT_SEGWIT:
                consensus.SegwitHeight = int{height};
                break;
            case Consensus::BuriedDeployment::DEPLOYMENT_HEIGHTINCB:
                consensus.BIP34Height = int{height};
                break;
            case Consensus::BuriedDeployment::DEPLOYMENT_DERSIG:
                consensus.BIP66Height = int{height};
                break;
            case Consensus::BuriedDeployment::DEPLOYMENT_CLTV:
                consensus.BIP65Height = int{height};
                break;
            case Consensus::BuriedDeployment::DEPLOYMENT_CSV:
                consensus.CSVHeight = int{height};
                break;
            }
        }

        for (const auto& [deployment_pos, version_bits_params] : opts.version_bits_parameters) {
            consensus.vDeployments[deployment_pos].nStartTime = version_bits_params.start_time;
            consensus.vDeployments[deployment_pos].nTimeout = version_bits_params.timeout;
            consensus.vDeployments[deployment_pos].min_activation_height = version_bits_params.min_activation_height;
        }

        genesis = CreateGenesisBlock(1296688602, 2, 0x207fffff, 1, 50 * COIN);
        consensus.hashGenesisBlock = genesis.GetHash();
        assert(consensus.hashGenesisBlock == uint256{"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"});
        assert(genesis.hashMerkleRoot == uint256{"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b"});

        vFixedSeeds.clear(); //!< Regtest mode doesn't have any fixed seeds.
        vSeeds.clear();
        vSeeds.emplace_back("dummySeed.invalid.");

        fDefaultConsistencyChecks = true;
        m_is_mockable_chain = true;

        checkpointData = {
            {
                {0, uint256{"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"}},
            }
        };

        m_assumeutxo_data = {
            {   // For use by unit tests
                .height = 110,
                .hash_serialized = AssumeutxoHash{uint256{"6657b736d4fe4db0cbc796789e812d5dba7f5c143764b1b6905612f1830609d1"}},
                .m_chain_tx_count = 111,
                .blockhash = consteval_ctor(uint256{"696e92821f65549c7ee134edceeeeaaa4105647a3c4fd9f298c0aec0ab50425c"}),
            },
            {
                // For use by fuzz target src/test/fuzz/utxo_snapshot.cpp
                .height = 200,
                .hash_serialized = AssumeutxoHash{uint256{"4f34d431c3e482f6b0d67b64609ece3964dc8d7976d02ac68dd7c9c1421738f2"}},
                .m_chain_tx_count = 201,
                .blockhash = consteval_ctor(uint256{"5e93653318f294fb5aa339d00bbf8cf1c3515488ad99412c37608b139ea63b27"}),
            },
            {
                // For use by test/functional/feature_assumeutxo.py
                .height = 299,
                .hash_serialized = AssumeutxoHash{uint256{"a4bf3407ccb2cc0145c49ebba8fa91199f8a3903daf0883875941497d2493c27"}},
                .m_chain_tx_count = 334,
                .blockhash = consteval_ctor(uint256{"3bb7ce5eba0be48939b7a521ac1ba9316afee2c7bada3a0cca24188e6d7d96c0"}),
            },
        };

        chainTxData = ChainTxData{
            0,
            0,
            0
        };

        base58Prefixes[PUBKEY_ADDRESS] = std::vector<unsigned char>(1,111);
        base58Prefixes[SCRIPT_ADDRESS] = std::vector<unsigned char>(1,196);
        base58Prefixes[SECRET_KEY] =     std::vector<unsigned char>(1,239);
        base58Prefixes[EXT_PUBLIC_KEY] = {0x04, 0x35, 0x87, 0xCF};
        base58Prefixes[EXT_SECRET_KEY] = {0x04, 0x35, 0x83, 0x94};

        bech32_hrp = "bcrt";
    }